

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86Mapping.c
# Opt level: O3

char * X86_insn_name(csh handle,uint id)

{
  if (0x50e < id) {
    return (char *)0x0;
  }
  return insn_name_maps[id].name;
}

Assistant:

const char *X86_insn_name(csh handle, unsigned int id)
{
#ifndef CAPSTONE_DIET
	if (id >= X86_INS_ENDING)
		return NULL;

	return insn_name_maps[id].name;
#else
	return NULL;
#endif
}